

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call.hpp
# Opt level: O3

function<chaiscript::Boxed_Value_()> * __thiscall
chaiscript::dispatch::functor<chaiscript::Boxed_Value()>
          (function<chaiscript::Boxed_Value_()> *__return_storage_ptr__,dispatch *this,
          Const_Proxy_Function *func,Type_Conversions_State *t_conversions)

{
  Type_Conversions_State *t_conversions_00;
  initializer_list<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_> __l;
  undefined1 local_39 [9];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_28;
  
  local_39._1_8_ = *(undefined8 *)this;
  p_Stack_30 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)this = 0;
  t_conversions_00 = (Type_Conversions_State *)local_39;
  __l._M_len = 1;
  __l._M_array = (iterator)(local_39 + 1);
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector(&local_28,__l,(allocator_type *)t_conversions_00);
  functor<chaiscript::Boxed_Value()>
            (__return_storage_ptr__,(dispatch *)&local_28,
             (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
              *)func,t_conversions_00);
  std::
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_28);
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::function<FunctionType> functor(Const_Proxy_Function func, const Type_Conversions_State *t_conversions) {
      return functor<FunctionType>(std::vector<Const_Proxy_Function>({std::move(func)}), t_conversions);
    }